

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3auxCloseMethod(sqlite3_vtab_cursor *pCursor)

{
  sqlite3_module *psVar1;
  
  psVar1 = pCursor->pVtab[1].pModule;
  sqlite3_blob_close((sqlite3_blob *)psVar1[2].xEof);
  psVar1[2].xEof = (_func_int_sqlite3_vtab_cursor_ptr *)0x0;
  sqlite3Fts3SegReaderFinish((Fts3MultiSegReader *)(pCursor + 1));
  sqlite3_free(pCursor[0xc].pVtab);
  sqlite3_free(pCursor[0xf].pVtab);
  sqlite3_free(pCursor[0x14].pVtab);
  sqlite3_free(pCursor);
  return 0;
}

Assistant:

static int fts3auxCloseMethod(sqlite3_vtab_cursor *pCursor){
  Fts3Table *pFts3 = ((Fts3auxTable *)pCursor->pVtab)->pFts3Tab;
  Fts3auxCursor *pCsr = (Fts3auxCursor *)pCursor;

  sqlite3Fts3SegmentsClose(pFts3);
  sqlite3Fts3SegReaderFinish(&pCsr->csr);
  sqlite3_free((void *)pCsr->filter.zTerm);
  sqlite3_free(pCsr->zStop);
  sqlite3_free(pCsr->aStat);
  sqlite3_free(pCsr);
  return SQLITE_OK;
}